

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
llvm::SmallVectorTemplateBase<unsigned_char,_true>::push_back
          (SmallVectorTemplateBase<unsigned_char,_true> *this,uchar *Elt)

{
  uint uVar1;
  
  uVar1 = (this->super_SmallVectorTemplateCommon<unsigned_char,_void>).super_SmallVectorBase.Size;
  if ((this->super_SmallVectorTemplateCommon<unsigned_char,_void>).super_SmallVectorBase.Capacity <=
      uVar1) {
    grow(this,0);
    uVar1 = (this->super_SmallVectorTemplateCommon<unsigned_char,_void>).super_SmallVectorBase.Size;
  }
  *(uchar *)((long)(this->super_SmallVectorTemplateCommon<unsigned_char,_void>).
                   super_SmallVectorBase.BeginX + (ulong)uVar1) = *Elt;
  SmallVectorBase::set_size
            ((SmallVectorBase *)this,
             (ulong)(this->super_SmallVectorTemplateCommon<unsigned_char,_void>).
                    super_SmallVectorBase.Size + 1);
  return;
}

Assistant:

void push_back(const T &Elt) {
    if (LLVM_UNLIKELY(this->size() >= this->capacity()))
      this->grow();
    memcpy(this->end(), &Elt, sizeof(T));
    this->set_size(this->size() + 1);
  }